

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpconvert.c
# Opt level: O0

void * custom_malloc(void *context,size_t size)

{
  undefined8 local_28;
  yabmp_uint8 *buffer;
  size_t size_local;
  void *context_local;
  
  allocation_current = allocation_current + 1;
  if (allocation_max < allocation_current) {
    context_local = (void *)0x0;
  }
  else {
    local_28 = malloc(size + 0x10);
    if (local_28 != (void *)0x0) {
      local_28 = (void *)((long)local_28 + 0x10);
    }
    context_local = local_28;
  }
  return context_local;
}

Assistant:

static void* custom_malloc(void* context, size_t size)
{
	yabmp_uint8* buffer;
	(void)context;
	
	allocation_current++;
	if (allocation_current > allocation_max) {
		return NULL;
	}
	buffer = malloc(size+16);
	if (buffer != NULL) {
		buffer += 16;
	}
	return buffer;
}